

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

void project_feature_handler_KILL_DOOR(project_feature_handler_context_t *context)

{
  uint32_t *puVar1;
  loc grid;
  chunk_conflict *c;
  _Bool _Var2;
  
  grid = context->grid;
  _Var2 = square_isdoor(cave,grid);
  if (_Var2) {
    _Var2 = square_isview(cave,grid);
    if (_Var2) {
      msg("There is a bright flash of light!");
      context->obvious = true;
      puVar1 = &player->upkeep->update;
      *puVar1 = *puVar1 | 0xc0;
      square_forget(cave,grid);
    }
    square_destroy_door(cave,grid);
    c = cave;
    if (cave->depth == 0) {
      _Var2 = is_daytime();
      expose_to_sun((chunk *)c,grid,_Var2);
      return;
    }
  }
  return;
}

Assistant:

static void project_feature_handler_KILL_DOOR(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Destroy all doors */
	if (square_isdoor(cave, grid)) {
		/* Check line of sight */
		if (square_isview(cave, grid)) {
			/* Message */
			msg("There is a bright flash of light!");
			context->obvious = true;

			/* Visibility change */
			player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

			/* Forget the door */
			square_forget(cave, grid);
		}

		/* Destroy the feature */
		square_destroy_door(cave, grid);

		/* On the surface, new terrain may be exposed to the sun. */
		if (cave->depth == 0) expose_to_sun(cave, grid, is_daytime());
	}
}